

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O2

void __thiscall
OpenMD::SectionParserManager::push_back(SectionParserManager *this,SectionParser *sp)

{
  SectionParserContextList *this_00;
  iterator iVar1;
  ostream *poVar2;
  value_type local_48;
  
  iVar1 = findSectionParser(this,&sp->sectionName_);
  this_00 = &this->sectionParsers_;
  if (iVar1._M_node != (_List_node_base *)this_00) {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&sp->sectionName_);
    poVar2 = std::operator<<(poVar2," section parser already exists");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  if ((this_00->
      super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>)
      ._M_impl._M_node.super__List_node_base._M_next == iVar1._M_node) {
    local_48.priority = this->beginPriority_;
  }
  else {
    local_48.priority =
         this->priorityDifference_ +
         *(int *)&(this->sectionParsers_).
                  super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                  ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  }
  local_48.lineNo = 0;
  local_48.offset._M_off = 0;
  local_48.offset._M_state.__count = 0;
  local_48.offset._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_48.isActive = false;
  local_48.sectionParser = sp;
  std::__cxx11::list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
  push_back(this_00,&local_48);
  return;
}

Assistant:

void SectionParserManager::push_back(SectionParser* sp) {
    SectionParserManager::iterator i;
    i = findSectionParser(sp->getSectionName());
    if (i != sectionParsers_.end()) {
      std::cerr << sp->getSectionName() << " section parser already exists"
                << std::endl;
      return;
    }

    SectionParserContext context;
    if (sectionParsers_.empty()) {
      context.priority = beginPriority_;
    } else {
      context.priority = sectionParsers_.back().priority + priorityDifference_;
    }

    context.sectionParser = sp;
    context.lineNo        = 0;
    context.offset        = 0;
    context.isActive      = false;

    sectionParsers_.push_back(context);
  }